

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_concat<int,false,6>
          (immutable *this,ref<immutable::rrb<int,_false,_6>_> *left,
          ref<immutable::rrb<int,_false,_6>_> *right)

{
  uint32_t uVar1;
  int iVar2;
  int *piVar3;
  uint32_t uVar4;
  rrb<int,_false,_6> *prVar5;
  rrb<int,_false,_6> *prVar6;
  rrb<int,_false,_6> *prVar7;
  leaf_node<int,_false> *plVar8;
  uint len;
  uint32_t i;
  ulong uVar9;
  uint uVar10;
  ref<immutable::rrb<int,_false,_6>_> left_head;
  ref<immutable::rrb_details::leaf_node<int,_false>_> empty_leaf;
  ref<immutable::rrb_details::internal_node<int,_false>_> root_candidate;
  ref<immutable::rrb<int,_false,_6>_> left2;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_50;
  ref<immutable::rrb_details::tree_node<int,_false>_> find_shift_arg;
  
  prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
  if (prVar5->cnt == 0) {
    prVar5 = right->ptr;
  }
  else {
    prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
    if (prVar5->cnt != 0) {
      prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
      if ((prVar5->root).ptr != (tree_node<int,_false> *)0x0) {
        empty_leaf.ptr = (leaf_node<int,_false> *)0x0;
        left_head.ptr = rrb_details::rrb_head_clone<int,false,6>(left->ptr);
        if (left_head.ptr != (rrb<int,_false,_6> *)0x0) {
          (left_head.ptr)->_ref_count = 1;
        }
        rrb_details::push_down_tail<int,false,6>((rrb_details *)&left2,left,&left_head,&empty_leaf);
        rrb_create<int,false,6>();
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(&left2);
        uVar4 = prVar5->cnt;
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
        uVar1 = prVar5->cnt;
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        prVar5->cnt = uVar4 + uVar1;
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(&left2);
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(&left2);
        uVar4 = prVar6->shift;
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
        prVar7 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
        rrb_details::concat_sub_tree<int,false,6>
                  ((rrb_details *)&root_candidate,&prVar5->root,uVar4,&prVar6->root,prVar7->shift,
                   true);
        find_shift_arg.ptr = (tree_node<int,_false> *)root_candidate.ptr;
        if (root_candidate.ptr != (internal_node<int,_false> *)0x0) {
          (root_candidate.ptr)->_ref_count = (root_candidate.ptr)->_ref_count + 1;
        }
        uVar4 = rrb_details::find_shift<int,false,6>(&find_shift_arg);
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        prVar5->shift = uVar4;
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        rrb_details::set_sizes<int,false,6>((rrb_details *)&local_50,&root_candidate,prVar5->shift);
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        ref<immutable::rrb_details::tree_node<int,false>>::operator=
                  ((ref<immutable::rrb_details::tree_node<int,false>> *)&prVar5->root,&local_50);
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&local_50);
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
        prVar6 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&prVar6->tail,&prVar5->tail);
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
        uVar4 = prVar5->tail_len;
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)this);
        prVar5->tail_len = uVar4;
        ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&find_shift_arg);
        ref<immutable::rrb_details::internal_node<int,_false>_>::~ref(&root_candidate);
        ref<immutable::rrb<int,_false,_6>_>::~ref(&left2);
        ref<immutable::rrb<int,_false,_6>_>::~ref(&left_head);
        rrb_details::release<int>(empty_leaf.ptr);
        return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
      }
      empty_leaf.ptr = (leaf_node<int,_false> *)rrb_details::rrb_head_clone<int,false,6>(left->ptr);
      if ((rrb<int,_false,_6> *)empty_leaf.ptr != (rrb<int,_false,_6> *)0x0) {
        ((rrb<int,_false,_6> *)empty_leaf.ptr)->_ref_count = 1;
      }
      prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
      uVar4 = prVar5->cnt;
      prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                         ((ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf);
      prVar5->cnt = prVar5->cnt + uVar4;
      prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
      if (prVar5->tail_len == 0x40) {
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
        uVar4 = prVar5->tail_len;
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                           ((ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf);
        prVar5->tail_len = uVar4;
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
        rrb_details::push_down_tail<int,false,6>
                  ((rrb_details *)this,left,(ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf,
                   &prVar5->tail);
      }
      else {
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
        uVar4 = prVar5->tail_len;
        prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
        if (uVar4 + prVar5->tail_len < 0x41) {
          prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
          uVar4 = prVar5->tail_len;
          prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
          uVar1 = prVar5->tail_len;
          prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
          plVar8 = (prVar5->tail).ptr;
          prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
          left_head.ptr =
               (rrb<int,_false,_6> *)
               rrb_details::leaf_node_merge<int,false>(plVar8,(prVar5->tail).ptr);
          if (left_head.ptr != (rrb<int,_false,_6> *)0x0) {
            (left_head.ptr)->tail_len = 1;
          }
          prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                             ((ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf);
          ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                    (&prVar5->tail,(ref<immutable::rrb_details::leaf_node<int,_false>_> *)&left_head
                    );
          prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                             ((ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf);
          prVar5->tail_len = uVar1 + uVar4;
          *(leaf_node<int,_false> **)this = empty_leaf.ptr;
          if (empty_leaf.ptr != (leaf_node<int,_false> *)0x0) {
            empty_leaf.ptr[1]._ref_count = empty_leaf.ptr[1]._ref_count + 1;
          }
        }
        else {
          left_head.ptr = (rrb<int,_false,_6> *)rrb_details::leaf_node_create<int,false>(0x40);
          if (left_head.ptr != (rrb<int,_false,_6> *)0x0) {
            (left_head.ptr)->tail_len = 1;
          }
          uVar9 = 0;
          while( true ) {
            prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
            uVar10 = prVar5->tail_len;
            prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
            if (uVar10 <= uVar9) break;
            plVar8 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&prVar5->tail);
            iVar2 = plVar8->child[uVar9];
            plVar8 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                               ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&left_head);
            plVar8->child[uVar9] = iVar2;
            uVar9 = uVar9 + 1;
          }
          uVar10 = 0x40 - prVar5->tail_len;
          for (uVar9 = 0; prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right),
              uVar10 != uVar9; uVar9 = uVar9 + 1) {
            plVar8 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&prVar5->tail);
            iVar2 = plVar8->child[uVar9];
            plVar8 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                               ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&left_head);
            piVar3 = plVar8->child;
            prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(left);
            piVar3[prVar5->tail_len + (int)uVar9] = iVar2;
          }
          len = prVar5->tail_len - uVar10;
          left2.ptr = (rrb<int,_false,_6> *)rrb_details::leaf_node_create<int,false>(len);
          if (left2.ptr != (rrb<int,_false,_6> *)0x0) {
            (left2.ptr)->tail_len = 1;
          }
          for (uVar9 = 0; len != uVar9; uVar9 = uVar9 + 1) {
            prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->(right);
            plVar8 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->(&prVar5->tail);
            iVar2 = plVar8->child[uVar10 + (int)uVar9];
            plVar8 = ref<immutable::rrb_details::leaf_node<int,_false>_>::operator->
                               ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)&left2);
            plVar8->child[uVar9] = iVar2;
          }
          prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                             ((ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf);
          ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                    (&prVar5->tail,(ref<immutable::rrb_details::leaf_node<int,_false>_> *)&left_head
                    );
          prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                             ((ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf);
          prVar5->tail_len = len;
          root_candidate.ptr =
               (internal_node<int,_false> *)rrb_details::rrb_head_clone<int,false,6>(left->ptr);
          if ((rrb<int,_false,_6> *)root_candidate.ptr != (rrb<int,_false,_6> *)0x0) {
            ((rrb<int,_false,_6> *)root_candidate.ptr)->_ref_count = 1;
          }
          prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                             ((ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf);
          uVar4 = prVar5->cnt;
          prVar5 = ref<immutable::rrb<int,_false,_6>_>::operator->
                             ((ref<immutable::rrb<int,_false,_6>_> *)&root_candidate);
          prVar5->cnt = uVar4 - len;
          rrb_details::push_down_tail<int,false,6>
                    ((rrb_details *)this,(ref<immutable::rrb<int,_false,_6>_> *)&root_candidate,
                     (ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf,
                     (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&left2);
          ref<immutable::rrb<int,_false,_6>_>::~ref
                    ((ref<immutable::rrb<int,_false,_6>_> *)&root_candidate);
          rrb_details::release<int>((leaf_node<int,_false> *)left2.ptr);
        }
        rrb_details::release<int>((leaf_node<int,_false> *)left_head.ptr);
      }
      ref<immutable::rrb<int,_false,_6>_>::~ref((ref<immutable::rrb<int,_false,_6>_> *)&empty_leaf);
      return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
    }
    prVar5 = left->ptr;
  }
  *(rrb<int,_false,_6> **)this = prVar5;
  if (prVar5 != (rrb<int,_false,_6> *)0x0) {
    prVar5->_ref_count = prVar5->_ref_count + 1;
  }
  return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> rrb_concat(const ref<rrb<T, atomic_ref_counting, N>>& left, const ref<rrb<T, atomic_ref_counting, N>>& right)
    {
    using namespace rrb_details;
    if (left->cnt == 0)
      {
      return right;
      }
    else if (right->cnt == 0)
      {
      return left;
      }
    else
      {
      if (right->root.ptr == nullptr)
        {
        // merge left and right tail, if possible
        ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_head_clone<T, atomic_ref_counting, N>(left.ptr);
        new_rrb->cnt += right->cnt;

        // skip merging if left tail is full.
        if (left->tail_len == bits<N>::rrb_branching)
          {
          new_rrb->tail_len = right->tail_len;
          return push_down_tail(left, new_rrb, right->tail);
          }
        // We can merge both tails into a single tail.
        else if (left->tail_len + right->tail_len <= bits<N>::rrb_branching)
          {
          const uint32_t new_tail_len = left->tail_len + right->tail_len;
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_merge<T, atomic_ref_counting>(left->tail.ptr, right->tail.ptr);
          new_rrb->tail = new_tail;
          new_rrb->tail_len = new_tail_len;
          return new_rrb;
          }
        else
          { // must push down something, and will have elements remaining in
            // the right tail
          ref<leaf_node<T, atomic_ref_counting>> push_down = leaf_node_create<T, atomic_ref_counting>(bits<N>::rrb_branching);
          //memcpy(&push_down->child[0], &left->tail->child[0], left->tail_len * sizeof(T));
          for (uint32_t i = 0; i < left->tail_len; ++i)
            push_down->child[i] = left->tail->child[i]; // don't memcpy, but use copy constructor
          const uint32_t right_cut = bits<N>::rrb_branching - left->tail_len;
          //memcpy(&push_down->child[left->tail_len], &right->tail->child[0], right_cut * sizeof(T));
          for (uint32_t i = 0; i < right_cut; ++i)
            push_down->child[left->tail_len + i] = right->tail->child[i]; // don't memcpy, but use copy constructor

          // this will be strictly positive.
          const uint32_t new_tail_len = right->tail_len - right_cut;
          ref<leaf_node<T, atomic_ref_counting>> new_tail = leaf_node_create<T, atomic_ref_counting>(new_tail_len);

          //memcpy(&new_tail->child[0], &right->tail->child[right_cut], new_tail_len * sizeof(T));
          for (uint32_t i = 0; i < new_tail_len; ++i)
            new_tail->child[i] = right->tail->child[right_cut + i]; // don't memcpy, but use copy constructor

          new_rrb->tail = push_down;
          new_rrb->tail_len = new_tail_len;

          // This is an imitation, so that push_down_tail works as we intend it
          // to: Whenever the height has to be increased, it calculates the size
          // table based upon the old rrb's size, minus the old tail. However,
          // since we manipulate the old tail to be longer than it actually was,
          // we have to reflect those changes in the cnt variable.

          ref<rrb<T, atomic_ref_counting, N>> left_imitation = rrb_head_clone(left.ptr);
          left_imitation->cnt = new_rrb->cnt - new_tail_len;

          return push_down_tail(left_imitation, new_rrb, new_tail);
          }
        }
      ref<leaf_node<T, atomic_ref_counting>> empty_leaf(nullptr);
      ref<rrb<T, atomic_ref_counting, N>> left_head = rrb_head_clone<T, atomic_ref_counting, N>(left.ptr);
      ref<rrb<T, atomic_ref_counting, N>> left2 = push_down_tail(left, left_head, empty_leaf);
      ref<rrb<T, atomic_ref_counting, N>> new_rrb = rrb_create<T, atomic_ref_counting, N>();
      new_rrb->cnt = left2->cnt + right->cnt;

      ref<internal_node<T, atomic_ref_counting>> root_candidate = concat_sub_tree<T, atomic_ref_counting, N>(left2->root, left2->shift, right->root, right->shift, true);

      ref<tree_node<T, atomic_ref_counting>> find_shift_arg = root_candidate;
      new_rrb->shift = find_shift<T, atomic_ref_counting, N>(find_shift_arg);
      // must be done before we set sizes.
      new_rrb->root = set_sizes<T, atomic_ref_counting, N>(root_candidate, new_rrb->shift);
      new_rrb->tail = right->tail;
      new_rrb->tail_len = right->tail_len;
      return new_rrb;
      }
    }